

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O1

string * cmStrCat<cm::static_string_view,std::__cxx11::string&,cm::static_string_view,cm::static_string_view>
                   (string *__return_storage_ptr__,static_string_view *a,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   static_string_view *args,static_string_view *args_1)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_68;
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  size_t local_38;
  char *pcStack_30;
  undefined8 local_28;
  size_t local_20;
  char *pcStack_18;
  undefined8 local_10;
  
  local_68.first._M_len = (a->super_string_view)._M_len;
  local_68.first._M_str = (a->super_string_view)._M_str;
  local_68.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48 = (b->_M_dataplus)._M_p;
  local_50 = b->_M_string_length;
  local_40 = 0;
  local_38 = (args->super_string_view)._M_len;
  pcStack_30 = (args->super_string_view)._M_str;
  local_28 = 0;
  local_20 = (args_1->super_string_view)._M_len;
  pcStack_18 = (args_1->super_string_view)._M_str;
  local_10 = 0;
  views._M_len = 4;
  views._M_array = &local_68;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}